

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

double __thiscall VCCluster::energy(VCCluster *this)

{
  double dVar1;
  double dVar2;
  ResScalar RVar3;
  ResScalar RVar4;
  Vector3d zi;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_28 [24];
  
  (*this->_vptr_VCCluster[7])(local_28,this);
  dVar1 = this->area;
  dVar2 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    RVar3 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
            ::run(local_28,local_28);
    RVar4 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
            ::run(local_28,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->weightedSum);
    dVar2 = dVar1 * RVar3 - (RVar4 + RVar4);
  }
  return dVar2;
}

Assistant:

double VCCluster::energy() {
	Vector3d zi = center();
	return area == 0 ? ENG_NULL : area * zi.dot(zi) - 2 * zi.dot(weightedSum);
}